

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_int64 StreamReadLine(io_private *pDev,char **pzData,jx9_int64 nMaxLen)

{
  uint uVar1;
  jx9_io_stream *pjVar2;
  long lVar3;
  uint uVar4;
  jx9_int64 jVar5;
  sxu32 sVar7;
  char *pcVar8;
  long lVar9;
  jx9_int64 jVar10;
  char zBuf [8192];
  undefined1 local_2038 [8200];
  ulong uVar6;
  
  pjVar2 = pDev->pStream;
  uVar1 = (pDev->sBuffer).nByte;
  uVar4 = pDev->nOfft;
  if (uVar4 < uVar1) {
    pcVar8 = (char *)((long)(pDev->sBuffer).pBlob + (ulong)uVar4);
    lVar9 = 0;
    do {
      if (pcVar8[lVar9] == '\n') {
        uVar6 = lVar9 + 1;
        *pzData = pcVar8;
        sVar7 = uVar4 + (int)lVar9 + 1;
        goto LAB_0013f756;
      }
      lVar3 = lVar9 + 1;
      lVar9 = lVar9 + 1;
    } while (pcVar8 + lVar3 < pcVar8 + (uVar1 - uVar4));
  }
  else {
    (pDev->sBuffer).nByte = 0;
    uVar1 = (pDev->sBuffer).nFlags;
    if ((uVar1 & 4) != 0) {
      (pDev->sBuffer).pBlob = (void *)0x0;
      (pDev->sBuffer).mByte = 0;
      (pDev->sBuffer).nFlags = uVar1 & 0xfffffffb;
    }
    pDev->nOfft = 0;
  }
  jVar10 = 0x2000;
  if (nMaxLen - 1U < 0x1fff) {
    jVar10 = nMaxLen;
  }
  do {
    jVar5 = (*pjVar2->xRead)(pDev->pHandle,local_2038,jVar10);
    if (jVar5 < 1) {
      uVar1 = (pDev->sBuffer).nByte;
      uVar4 = pDev->nOfft;
      if (uVar1 == uVar4) {
        return jVar5;
      }
      *pzData = (char *)((ulong)uVar4 + (long)(pDev->sBuffer).pBlob);
      uVar6 = (ulong)(uVar1 - uVar4);
      goto LAB_0013f788;
    }
    SyBlobAppend(&pDev->sBuffer,local_2038,(sxu32)jVar5);
    uVar1 = pDev->nOfft;
    pcVar8 = (char *)((ulong)uVar1 + (long)(pDev->sBuffer).pBlob);
    uVar4 = (pDev->sBuffer).nByte - uVar1;
    uVar6 = (ulong)uVar4;
    if (uVar4 != 0) {
      lVar9 = 0;
      do {
        if (pcVar8[lVar9] == '\n') {
          uVar6 = lVar9 + 1;
          *pzData = pcVar8;
          sVar7 = uVar1 + (int)lVar9 + 1;
          goto LAB_0013f756;
        }
        lVar3 = lVar9 + 1;
        lVar9 = lVar9 + 1;
      } while (pcVar8 + lVar3 < pcVar8 + uVar6);
    }
  } while ((long)uVar6 < nMaxLen || nMaxLen < 1);
  *pzData = pcVar8;
LAB_0013f788:
  (pDev->sBuffer).nByte = 0;
  uVar1 = (pDev->sBuffer).nFlags;
  sVar7 = 0;
  if ((uVar1 & 4) != 0) {
    (pDev->sBuffer).pBlob = (void *)0x0;
    (pDev->sBuffer).mByte = 0;
    (pDev->sBuffer).nFlags = uVar1 & 0xfffffffb;
    sVar7 = 0;
  }
LAB_0013f756:
  pDev->nOfft = sVar7;
  return uVar6;
}

Assistant:

static jx9_int64 StreamReadLine(io_private *pDev, const char **pzData, jx9_int64 nMaxLen)
{
	const jx9_io_stream *pStream = pDev->pStream;
	char zBuf[8192];
	jx9_int64 n;
	sxi32 rc;
	n = 0;
	if( pDev->nOfft >= SyBlobLength(&pDev->sBuffer) ){
		/* Reset the working buffer so that we avoid excessive memory allocation */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Check if there is a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got line, update the cursor  */
			pDev->nOfft += (sxu32)n;
			return n;
		}
	}
	/* Perform the read operation until a new line is extracted or length
	 * limit is reached.
	 */
	for(;;){
		n = pStream->xRead(pDev->pHandle, zBuf, (nMaxLen > 0 && nMaxLen < sizeof(zBuf)) ? nMaxLen : sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Append the data just read */
		SyBlobAppend(&pDev->sBuffer, zBuf, (sxu32)n);
		/* Try to extract a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got one, return immediately */
			pDev->nOfft += (sxu32)n;
			return n;
		}
		if( nMaxLen > 0 && (SyBlobLength(&pDev->sBuffer) - pDev->nOfft >= nMaxLen) ){
			/* Read limit reached, return the available data */
			*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
			n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
			/* Reset the working buffer */
			SyBlobReset(&pDev->sBuffer);
			pDev->nOfft = 0;
			return n;
		}
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Read limit reached, return the available data */
		*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
		n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
		/* Reset the working buffer */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	return n;
}